

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

span<slang::parsing::Token,_18446744073709551615UL> __thiscall
slang::parsing::Preprocessor::MacroParser::parseTokenList(MacroParser *this,bool allowNewlines)

{
  Preprocessor *this_00;
  bool bVar1;
  TokenKind TVar2;
  SourceLocation location;
  Diagnostic *this_01;
  undefined4 extraout_var;
  Info *src;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  TokenKind kind;
  Token TVar3;
  string_view arg;
  span<slang::parsing::Token,_18446744073709551615UL> sVar4;
  TokenKind closeKind;
  SmallVector<slang::parsing::TokenKind,_20UL> delimPairStack;
  SmallVector<slang::parsing::Token,_16UL> tokens;
  Token local_198;
  SmallVectorBase<slang::parsing::TokenKind> local_188 [2];
  SmallVectorBase<slang::parsing::Token> local_148 [7];
  
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 0x10;
  local_188[0].data_ = (pointer)local_188[0].firstElement;
  local_188[0].len = 0;
  local_188[0].cap = 0x14;
  while( true ) {
    TVar3 = peek(this);
    src = TVar3.info;
    kind = TVar3.kind;
    if (kind == EndOfFile) break;
    if (!allowNewlines) {
      local_198 = peek(this);
      bVar1 = Token::isOnSameLine(&local_198);
      src = extraout_RDX;
      if (!bVar1) break;
    }
    if (local_188[0].len == 0) {
      if ((kind == CloseParenthesis) || ((TVar3._0_4_ & 0xffff) == 0x18)) goto LAB_00301775;
    }
    else if (*(TokenKind *)((long)local_188[0].data_ + (local_188[0].len - 1) * 2) == kind) {
      local_188[0].len = local_188[0].len - 1;
    }
    local_198 = consume(this);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
              (local_148,&local_198);
    TVar2 = slang::syntax::SyntaxFacts::getDelimCloseKind(kind);
    local_198.kind = TVar2;
    if (TVar2 != Unknown) {
      SmallVectorBase<slang::parsing::TokenKind>::emplace_back<slang::parsing::TokenKind_const&>
                (local_188,&local_198.kind);
    }
  }
  if (local_188[0].len != 0) {
    this_00 = this->pp;
    location = Token::location(local_148[0].data_ + (local_148[0].len - 1));
    this_01 = Preprocessor::addDiag(this_00,(DiagCode)0x170004,location);
    arg = LexerFacts::getTokenKindText
                    (*(TokenKind *)((long)local_188[0].data_ + (local_188[0].len - 1) * 2));
    Diagnostic::operator<<(this_01,arg);
    src = extraout_RDX_00;
  }
LAB_00301775:
  sVar4._M_ptr._0_4_ =
       SmallVectorBase<slang::parsing::Token>::copy
                 (local_148,(EVP_PKEY_CTX *)this->pp->alloc,(EVP_PKEY_CTX *)src);
  sVar4._M_ptr._4_4_ = extraout_var;
  if (local_188[0].data_ != (pointer)local_188[0].firstElement) {
    operator_delete(local_188[0].data_);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    operator_delete(local_148[0].data_);
  }
  sVar4._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar4;
}

Assistant:

std::span<Token> Preprocessor::MacroParser::parseTokenList(bool allowNewlines) {
    SmallVector<Token, 16> tokens;
    SmallVector<TokenKind> delimPairStack;

    // Comma and right parenthesis only end the default token list if they are
    // not inside a nested pair of (), [], or {}, otherwise, keep swallowing
    // tokens as part of the list.
    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::EndOfFile || (!allowNewlines && !peek().isOnSameLine())) {
            if (!delimPairStack.empty()) {
                pp.addDiag(diag::UnbalancedMacroArgDims, tokens.back().location())
                    << LF::getTokenKindText(delimPairStack.back());
            }
            break;
        }

        if (delimPairStack.empty()) {
            if (kind == TokenKind::Comma || kind == TokenKind::CloseParenthesis)
                break;
        }
        else if (delimPairStack.back() == kind) {
            delimPairStack.pop_back();
        }

        tokens.push_back(consume());

        TokenKind closeKind = SyntaxFacts::getDelimCloseKind(kind);
        if (closeKind != TokenKind::Unknown)
            delimPairStack.push_back(closeKind);
    }
    return tokens.copy(pp.alloc);
}